

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

int MPIU_Alltoallv(void *sendbuf,int *sendcnts,int *sdispls,MPI_Datatype sendtype,void *recvbuf,
                  int *recvcnts,int *rdispls,MPI_Datatype recvtype,MPI_Comm comm,
                  MPIU_AlltoallvSparsePolicy policy)

{
  int local_74;
  uint local_70;
  int ret;
  int dense;
  int totalrecv;
  int *a_rdispls;
  int *a_recvcnts;
  int *a_sdispls;
  int nn;
  int i;
  int NTask;
  int ThisTask;
  int *recvcnts_local;
  void *recvbuf_local;
  MPI_Datatype sendtype_local;
  int *sdispls_local;
  int *sendcnts_local;
  void *sendbuf_local;
  
  _NTask = recvcnts;
  recvcnts_local = (int *)recvbuf;
  recvbuf_local = sendtype;
  sendtype_local = (MPI_Datatype)sdispls;
  sdispls_local = sendcnts;
  sendcnts_local = (int *)sendbuf;
  MPI_Comm_rank(comm,&i);
  MPI_Comm_size(comm,&nn);
  a_sdispls._0_4_ = 0;
  a_recvcnts = (int *)0x0;
  a_rdispls = (int *)0x0;
  _dense = (int *)0x0;
  for (a_sdispls._4_4_ = 0; a_sdispls._4_4_ < nn; a_sdispls._4_4_ = a_sdispls._4_4_ + 1) {
    if (0 < sdispls_local[a_sdispls._4_4_]) {
      a_sdispls._0_4_ = (int)a_sdispls + 1;
    }
  }
  if (_NTask == (int *)0x0) {
    a_rdispls = (int *)malloc((long)nn << 2);
    _NTask = a_rdispls;
    MPI_Alltoall(sdispls_local,1,&ompi_mpi_int,a_rdispls,1,&ompi_mpi_int,comm);
  }
  if (recvcnts_local == (int *)0x0) {
    ret = 0;
    for (a_sdispls._4_4_ = 0; a_sdispls._4_4_ < nn; a_sdispls._4_4_ = a_sdispls._4_4_ + 1) {
      ret = _NTask[a_sdispls._4_4_] + ret;
    }
    if (a_rdispls != (int *)0x0) {
      free(a_rdispls);
    }
    sendbuf_local._4_4_ = ret;
  }
  else {
    if (sendtype_local == (MPI_Datatype)0x0) {
      a_recvcnts = (int *)malloc((long)nn << 2);
      *a_recvcnts = 0;
      for (a_sdispls._4_4_ = 1; sendtype_local = (MPI_Datatype)a_recvcnts, a_sdispls._4_4_ < nn;
          a_sdispls._4_4_ = a_sdispls._4_4_ + 1) {
        *(int *)((long)a_recvcnts + (long)a_sdispls._4_4_ * 4) =
             *(int *)((long)a_recvcnts + (long)(a_sdispls._4_4_ + -1) * 4) +
             sdispls_local[a_sdispls._4_4_ + -1];
      }
    }
    if (rdispls == (int *)0x0) {
      rdispls = (int *)malloc((long)nn << 2);
      *rdispls = 0;
      for (a_sdispls._4_4_ = 1; _dense = rdispls, a_sdispls._4_4_ < nn;
          a_sdispls._4_4_ = a_sdispls._4_4_ + 1) {
        rdispls[a_sdispls._4_4_] = rdispls[a_sdispls._4_4_ + -1] + _NTask[a_sdispls._4_4_ + -1];
      }
    }
    if (policy == AUTO) {
      local_70 = (uint)(0x80 < (int)a_sdispls);
      MPI_Allreduce(1,&local_70,1,&ompi_mpi_int,&ompi_mpi_op_sum,comm);
    }
    if (policy == DISABLED) {
      local_70 = 1;
    }
    if (policy == REQUIRED) {
      local_70 = 0;
    }
    if (local_70 == 0) {
      local_74 = MPI_Alltoallv_sparse
                           (sendcnts_local,sdispls_local,(int *)sendtype_local,
                            (MPI_Datatype)recvbuf_local,recvcnts_local,_NTask,rdispls,recvtype,comm)
      ;
    }
    else {
      local_74 = MPI_Alltoallv(sendcnts_local,sdispls_local,sendtype_local,recvbuf_local,
                               recvcnts_local,_NTask,rdispls,recvtype,comm);
    }
    if (_dense != (int *)0x0) {
      free(_dense);
    }
    if (a_recvcnts != (int *)0x0) {
      free(a_recvcnts);
    }
    if (a_rdispls != (int *)0x0) {
      free(a_rdispls);
    }
    sendbuf_local._4_4_ = local_74;
  }
  return sendbuf_local._4_4_;
}

Assistant:

int MPIU_Alltoallv(void *sendbuf, int *sendcnts, int *sdispls,
        MPI_Datatype sendtype, void *recvbuf, int *recvcnts,
        int *rdispls, MPI_Datatype recvtype, MPI_Comm comm,
        enum MPIU_AlltoallvSparsePolicy policy
)
/*
 * sdispls, recvcnts rdispls can be NULL,
 *
 * if recvbuf is NULL, returns total number of item required to hold the
 * data.
 * */
{
    int ThisTask;
    int NTask;
    MPI_Comm_rank(comm, &ThisTask);
    MPI_Comm_size(comm, &NTask);
    int i;
    int nn = 0;
    int *a_sdispls=NULL, *a_recvcnts=NULL, *a_rdispls=NULL;
    for(i = 0; i < NTask; i ++) {
        if(sendcnts[i] > 0) {
            nn ++;
        }
    }
    if(recvcnts == NULL) {
        a_recvcnts = malloc(sizeof(int) * NTask);
        recvcnts = a_recvcnts;
        MPI_Alltoall(sendcnts, 1, MPI_INT,
                     recvcnts, 1, MPI_INT, comm);
    }
    if(recvbuf == NULL) {
        int totalrecv = 0;
        for(i = 0; i < NTask; i ++) {
            totalrecv += recvcnts[i];
        }
        if(a_recvcnts)
            free(a_recvcnts);
        return totalrecv;
    }
    if(sdispls == NULL) {
        a_sdispls = malloc(sizeof(int) * NTask);
        sdispls = a_sdispls;
        sdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            sdispls[i] = sdispls[i - 1] + sendcnts[i - 1];
        }
    }
    if(rdispls == NULL) {
        a_rdispls = malloc(sizeof(int) * NTask);
        rdispls = a_rdispls;
        rdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            rdispls[i] = rdispls[i - 1] + recvcnts[i - 1];
        }
    }

    int dense;

    if(policy == AUTO) {
        dense = nn > 128;
        MPI_Allreduce(MPI_IN_PLACE, &dense, 1, MPI_INT, MPI_SUM, comm);
    }
    if(policy == DISABLED) {
        dense = 1;
    }
    if(policy == REQUIRED) {
        dense = 0;
    }

    int ret;
    if(dense != 0) {
        ret = MPI_Alltoallv(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    } else {
        ret = MPI_Alltoallv_sparse(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    }

    if(a_rdispls)
        free(a_rdispls);
    if(a_sdispls)
        free(a_sdispls);
    if(a_recvcnts)
        free(a_recvcnts);
    return ret;
}